

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_vsnprintf(mg_connection *conn,int *truncated,char *buf,size_t buflen,char *fmt,
                 __va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char *func;
  ulong uVar4;
  
  if (buflen == 0) {
    if (truncated != (int *)0x0) {
      *truncated = 1;
    }
  }
  else {
    uVar2 = vsnprintf(buf,buflen,fmt,ap);
    uVar1 = uVar2 >> 8;
    bVar3 = buflen <= (ulong)(long)(int)uVar2 || (int)uVar2 < 0;
    if (bVar3) {
      if (truncated != (int *)0x0) {
        *truncated = 1;
      }
      uVar2 = (int)buflen - 1;
      uVar4 = 200;
      if (buflen < 0xc9) {
        uVar4 = (ulong)uVar2;
      }
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,func,(uint)CONCAT71((int7)(int3)uVar1,bVar3),
                 "truncating vsnprintf buffer: [%.*s]",uVar4,buf);
    }
    else if (truncated != (int *)0x0) {
      *truncated = 0;
    }
    buf[(int)uVar2] = '\0';
  }
  return;
}

Assistant:

static void
mg_vsnprintf(const struct mg_connection *conn,
             int *truncated,
             char *buf,
             size_t buflen,
             const char *fmt,
             va_list ap)
{
	int n, ok;

	if (buflen == 0) {
		if (truncated) {
			*truncated = 1;
		}
		return;
	}

#if defined(__clang__)
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
	/* Using fmt as a non-literal is intended here, since it is mostly called
	 * indirectly by mg_snprintf */
#endif

	n = (int)vsnprintf_impl(buf, buflen, fmt, ap);
	ok = (n >= 0) && ((size_t)n < buflen);

#if defined(__clang__)
#pragma clang diagnostic pop
#endif

	if (ok) {
		if (truncated) {
			*truncated = 0;
		}
	} else {
		if (truncated) {
			*truncated = 1;
		}
		mg_cry_internal(conn,
		                "truncating vsnprintf buffer: [%.*s]",
		                (int)((buflen > 200) ? 200 : (buflen - 1)),
		                buf);
		n = (int)buflen - 1;
	}
	buf[n] = '\0';
}